

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_seqdiff.cpp
# Opt level: O0

void __thiscall argparse::args_t::~args_t(args_t *this)

{
  long *in_RDI;
  
  if ((in_RDI[2] != 0) && (in_RDI[2] != _stdout)) {
    fclose((FILE *)in_RDI[2]);
  }
  if ((*in_RDI != 0) && (*in_RDI != _stdin)) {
    fclose((FILE *)*in_RDI);
  }
  if ((in_RDI[1] != 0) && (in_RDI[1] != _stdin)) {
    fclose((FILE *)in_RDI[1]);
  }
  return;
}

Assistant:

args_t::~args_t() {
    if ( output && output != stdout )
      fclose( output );
    
    if ( input && input != stdin)
      fclose (input);
      
    if ( reference && reference != stdin)
     fclose (reference);
    
  }